

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

bool __thiscall TURBOLINECOUNT::CLineCount::countLines(CLineCount *this,tlc_linecount_t *linecount)

{
  pointer plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  char *__s;
  ulong uVar9;
  string *this_00;
  int i;
  uint uVar10;
  long lVar11;
  stat64 statbuf;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  stat64 local_b8;
  size_type __new_size;
  
  iVar5 = fstat64(this->m_fh,&local_b8);
  if (iVar5 == 0) {
    this->m_filesize = local_b8.st_size;
    if (local_b8.st_size == 0) {
      *linecount = 0;
    }
    else {
      uVar9 = (this->m_parameters).buffersize;
      uVar10 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar9;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (local_b8.st_size + uVar9) - 1;
      iVar5 = (this->m_parameters).threadcount;
      iVar6 = SUB164(auVar3 / auVar2,0);
      __new_size = (size_type)iVar6;
      if ((long)iVar5 <= SUB168(auVar3 / auVar2,0)) {
        iVar6 = iVar5;
        __new_size = (long)iVar5;
      }
      this->m_actual_thread_count = iVar6;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->m_threads,__new_size);
      std::vector<long,_std::allocator<long>_>::resize
                (&this->m_threadlinecounts,(long)this->m_actual_thread_count);
      this->m_thread_fail = false;
      for (; uVar7 = this->m_actual_thread_count, (int)uVar10 < this->m_actual_thread_count;
          uVar10 = uVar10 + 1) {
        bVar4 = createThread(this,uVar10);
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_f8,"failed to create counting thread",&local_119);
          this->m_lasterror = 10;
          std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
          std::__cxx11::string::~string(local_f8);
          this->m_thread_fail = true;
          this->m_actual_thread_count = uVar10;
          uVar7 = uVar10;
          break;
        }
      }
      uVar10 = 0;
      for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
        iVar5 = pthread_join((this->m_threads).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar11],(void **)0x0);
        uVar10 = uVar10 + (iVar5 == 0);
        uVar7 = this->m_actual_thread_count;
      }
      if (this->m_thread_fail != false) goto LAB_00102bba;
      if (uVar10 != uVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_118,"thread join failed",&local_119);
        this->m_lasterror = 10;
        std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
        this_00 = local_118;
        goto LAB_00102bb5;
      }
      *linecount = 0;
      plVar1 = (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        lVar11 = lVar11 + plVar1[uVar9];
        *linecount = lVar11;
      }
    }
    bVar4 = true;
  }
  else {
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    __s = strerror(iVar5);
    std::__cxx11::string::string<std::allocator<char>>(local_d8,__s,&local_119);
    this->m_lasterror = iVar5;
    std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
    this_00 = local_d8;
LAB_00102bb5:
    std::__cxx11::string::~string(this_00);
LAB_00102bba:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CLineCount::countLines(tlc_linecount_t & linecount)
{
	// Determine file size
#ifdef _WIN32
	LARGE_INTEGER li;
	if (!GetFileSizeEx(m_fh, &li))
	{
		LCSETREALLASTERROR(EBADF, _T("unable to get file size"));
		return false;
	}
	m_filesize = li.QuadPart;
#else
	struct STAT statbuf;
	if(FSTAT(m_fh,&statbuf)!=0)
	{
		LCSETREALLASTERROR(EBADF, _T("unable to get file size"));
		return false;
	}
	m_filesize = statbuf.st_size;
#endif

	// Exit now for empty files
	if (m_filesize == 0)
	{
		linecount = 0;
		return true;
	}

	// Figure out actual thread count
	tlc_fileoffset_t windowcount = (m_filesize + (m_parameters.buffersize - 1)) / m_parameters.buffersize;
	if (windowcount < (tlc_fileoffset_t) m_parameters.threadcount)
	{
		m_actual_thread_count = (int)windowcount;
	}
	else
	{
		m_actual_thread_count = m_parameters.threadcount;
	}

//	printf("act: %d\n",m_actual_thread_count);

#ifdef _WIN32
	// Prepare file mapping
	m_filemapping = CreateFileMapping(m_fh, NULL, PAGE_READONLY, 0, 0, NULL);
#endif

	// Spin up threads
	m_threads.resize(m_actual_thread_count);
	m_threadlinecounts.resize(m_actual_thread_count);
	m_thread_fail = false;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		if (!createThread(i))
		{
			setLastError(ECHILD, _T("failed to create counting thread"));
			
			m_thread_fail = true;

			m_actual_thread_count = i;
			break;
		}
	}

	// Wait for threads to complete
	int complete = 0;
	int errors = 0;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		bool success = false;

#ifdef _WIN32
		success = (WaitForSingleObject(m_threads[i], INFINITE) == WAIT_OBJECT_0);
#else
		success = pthread_join(m_threads[i], NULL) == 0;
#endif
	
		if (success)
		{
			complete++;
		}
		else
		{
			errors++;
		}
	}

#ifdef _WIN32
	// Clean up file mapping
	CloseHandle(m_filemapping);
#endif

	if (m_thread_fail)
	{
		return false;
	}

	if (complete != m_actual_thread_count)
	{
		setLastError(ECHILD, _T("thread join failed"));
		return false;
	}

	// Sum up thread line counts and return
	linecount = 0;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		linecount += m_threadlinecounts[i];
	}
	
	return true;
}